

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void __thiscall
wasm::TypeMapper::map
          (TypeMapper *this,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *additionalPrivateTypes)

{
  unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
  *this_00;
  iterator iVar1;
  bool bVar2;
  reference __in;
  type *__k;
  pointer ppVar3;
  mapped_type *pmVar4;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_a0 [3];
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_88;
  iterator it;
  type *dest;
  type *src;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_68;
  const_iterator __end2;
  const_iterator __begin2;
  TypeUpdates *__range2;
  TypeMap newMapping;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *additionalPrivateTypes_local;
  TypeMapper *this_local;
  
  newMapping._M_h._M_single_bucket = (__node_base_ptr)additionalPrivateTypes;
  GlobalTypeRewriter::rebuildTypes
            ((TypeMap *)&__range2,&this->super_GlobalTypeRewriter,additionalPrivateTypes);
  this_00 = this->mapping;
  __end2 = std::
           unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
           ::begin(this_00);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
       ::end(this_00);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                       ,&local_68);
    if (!bVar2) break;
    __in = std::__detail::
           _Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
           operator*(&__end2);
    __k = std::get<0ul,wasm::HeapType_const,wasm::HeapType>(__in);
    it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>)
         std::get<1ul,wasm::HeapType_const,wasm::HeapType>(__in);
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
         ::find((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                 *)&__range2,
                (key_type *)
                it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
                _M_cur);
    local_a0[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
         ::end((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                *)&__range2);
    bVar2 = std::__detail::operator!=(&local_88,local_a0);
    iVar1 = it;
    if (bVar2) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>
                           *)&local_88);
      pmVar4 = std::
               unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
               ::operator[]((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                             *)&__range2,__k);
      pmVar4->id = (ppVar3->second).id;
    }
    else {
      pmVar4 = std::
               unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
               ::operator[]((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                             *)&__range2,__k);
      pmVar4->id = *(uintptr_t *)
                    iVar1.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                    ._M_cur;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::operator++
              (&__end2);
  }
  GlobalTypeRewriter::mapTypes(&this->super_GlobalTypeRewriter,(TypeMap *)&__range2);
  std::
  unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
  ::~unordered_map((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                    *)&__range2);
  return;
}

Assistant:

void map(const std::vector<HeapType>& additionalPrivateTypes = {}) {
    // Update the internals of types (struct fields, signatures, etc.) to
    // refer to the merged types.
    auto newMapping = rebuildTypes(additionalPrivateTypes);

    // Compose the user-provided mapping from old types to other old types with
    // the new mapping from old types to new types. `newMapping` will become
    // a copy of `mapping` except that the destination types will be the newly
    // built types.
    for (auto& [src, dest] : mapping) {
      if (auto it = newMapping.find(dest); it != newMapping.end()) {
        newMapping[src] = it->second;
      } else {
        // This mapping was to a type that was not rebuilt, perhaps because it
        // is a basic type. Just use this mapping unmodified.
        newMapping[src] = dest;
      }
    }

    // Map the types of expressions (curr->type, etc.) to the correct new types.
    mapTypes(newMapping);
  }